

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floattype.cpp
# Opt level: O2

Token * __thiscall
FloatType::parseNumber
          (Token *__return_storage_ptr__,FloatType *this,string *str,char *current,size_t *index)

{
  Token *pTVar1;
  bool bVar2;
  int iVar3;
  runtime_error *this_00;
  ulong uVar4;
  bool bVar5;
  initializer_list<NumericConstantChar> __l;
  NumericConstantChar local_72;
  allocator_type local_71;
  Token *local_70;
  NumericChars chars;
  NumericConstant local_50;
  
  local_70 = __return_storage_ptr__;
  local_72 = NumericConstantChars::getChar(*current);
  __l._M_len = 1;
  __l._M_array = &local_72;
  std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::vector
            (&chars,__l,&local_71);
  uVar4 = *index;
  bVar5 = false;
  while (uVar4 = uVar4 + 1, uVar4 < str->_M_string_length) {
    iVar3 = tolower((int)(str->_M_dataplus)._M_p[uVar4]);
    *current = (char)iVar3;
    if (iVar3 << 0x18 == 0x2e000000) {
      bVar2 = true;
      if (bVar5) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"The token already contains a decimal point.");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      bVar2 = bVar5;
      if (9 < ((iVar3 << 0x18) >> 0x18) - 0x30U) break;
    }
    bVar5 = bVar2;
    local_72 = NumericConstantChars::getChar((char)iVar3);
    std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::
    emplace_back<NumericConstantChar>(&chars,&local_72);
    *index = uVar4;
  }
  NumericConstant::NumericConstant(&local_50,&chars);
  pTVar1 = local_70;
  Token::Token(local_70,&local_50);
  std::_Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>::~_Vector_base
            ((_Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_> *)&local_50);
  std::_Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>::~_Vector_base
            (&chars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>);
  return pTVar1;
}

Assistant:

Token FloatType::parseNumber(std::string& str, char& current, std::size_t& index) const {
	NumericChars chars({ NumericConstantChars::getChar(current) });
	bool hasDecimalPoint = false;

	while (true) {
		std::size_t next = index + 1;

		if (next >= str.size()) {
			break;
		}

		current = (char)std::tolower(str[next]);

		if (current == '.') {
			if (!hasDecimalPoint) {
				hasDecimalPoint = true;
			} else {
				throw std::runtime_error("The token already contains a decimal point.");
			}
		} else {
			if (!isdigit(current)) {
				break;
			}
		}

		chars.push_back(NumericConstantChars::getChar(current));
		index = next;
	}

	return NumericConstant(chars);
}